

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
::clear(table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
        *this)

{
  group_type_pointer pgVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  group_type_pointer pgVar7;
  undefined1 auVar8 [16];
  
  ppVar6 = (this->arrays).elements_;
  if (ppVar6 != (value_type_pointer)0x0) {
    sVar3 = (this->arrays).groups_size_mask;
    pgVar7 = (this->arrays).groups_;
    pgVar1 = pgVar7 + sVar3;
    pgVar5 = pgVar7 + sVar3 + 1;
    for (; pgVar7 != pgVar5; pgVar7 = pgVar7 + 1) {
      auVar8[0] = -(pgVar7->m[0].n == '\0');
      auVar8[1] = -(pgVar7->m[1].n == '\0');
      auVar8[2] = -(pgVar7->m[2].n == '\0');
      auVar8[3] = -(pgVar7->m[3].n == '\0');
      auVar8[4] = -(pgVar7->m[4].n == '\0');
      auVar8[5] = -(pgVar7->m[5].n == '\0');
      auVar8[6] = -(pgVar7->m[6].n == '\0');
      auVar8[7] = -(pgVar7->m[7].n == '\0');
      auVar8[8] = -(pgVar7->m[8].n == '\0');
      auVar8[9] = -(pgVar7->m[9].n == '\0');
      auVar8[10] = -(pgVar7->m[10].n == '\0');
      auVar8[0xb] = -(pgVar7->m[0xb].n == '\0');
      auVar8[0xc] = -(pgVar7->m[0xc].n == '\0');
      auVar8[0xd] = -(pgVar7->m[0xd].n == '\0');
      auVar8[0xe] = -(pgVar7->m[0xe].n == '\0');
      auVar8[0xf] = -(pgVar7->m[0xf].n == '\0');
      for (uVar4 = ((uint)(pgVar1 != pgVar7) << 0xe | 0x3fff) &
                   ~(uint)(ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(auVar8[0xf] >> 7) << 0xf); uVar4 != 0;
          uVar4 = uVar4 - 1 & uVar4) {
        uVar2 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ppVar6[uVar2].second.
                    super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      pgVar7->m[0].n = (undefined1  [16])0x0;
      ppVar6 = ppVar6 + 0xf;
    }
    (this->arrays).groups_[(this->arrays).groups_size_mask].m[0xe].n = '\x01';
    sVar3 = initial_max_load(this);
    (this->size_ctrl).ml = sVar3;
    (this->size_ctrl).size = 0;
  }
  return;
}

Assistant:

group_type* groups() const noexcept { return std::to_address(groups_); }